

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O0

void __thiscall
llvm::dwarf::CFIProgram::addInstruction(CFIProgram *this,uint8_t Opcode,uint64_t Operand1)

{
  reference pvVar1;
  Instruction local_70;
  uint64_t local_20;
  uint64_t Operand1_local;
  CFIProgram *pCStack_10;
  uint8_t Opcode_local;
  CFIProgram *this_local;
  
  local_20 = Operand1;
  Operand1_local._7_1_ = Opcode;
  pCStack_10 = this;
  Instruction::Instruction(&local_70,Opcode);
  std::
  vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ::push_back(&this->Instructions,&local_70);
  Instruction::~Instruction(&local_70);
  pvVar1 = std::
           vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
           ::back(&this->Instructions);
  SmallVectorTemplateBase<unsigned_long,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_long,_true> *)&pvVar1->Ops,&local_20);
  return;
}

Assistant:

void addInstruction(uint8_t Opcode, uint64_t Operand1) {
    Instructions.push_back(Instruction(Opcode));
    Instructions.back().Ops.push_back(Operand1);
  }